

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

JavascriptGeneratorFunction *
Js::JavascriptGeneratorFunction::OP_NewScGenFuncHomeObj
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,Var homeObj)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *this;
  FunctionProxy *this_00;
  ScriptContext *this_01;
  ThreadContext *threadContext;
  JavascriptGeneratorFunction *pJVar4;
  JavascriptGeneratorFunction *genFunc;
  JsReentLock reentrancylock;
  Var homeObj_local;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  
  reentrancylock._24_8_ = homeObj;
  if (homeObj == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x5d,"(homeObj != nullptr)","homeObj != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  this_00 = FunctionInfo::GetFunctionProxy(this);
  this_01 = FunctionProxy::GetScriptContext(this_00);
  threadContext = ScriptContext::GetThreadContext(this_01);
  JsReentLock::JsReentLock((JsReentLock *)&genFunc,threadContext);
  pJVar4 = OP_NewScGenFunc(environment,infoRef);
  (*(pJVar4->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x74])(pJVar4,reentrancylock._24_8_);
  JsReentLock::~JsReentLock((JsReentLock *)&genFunc);
  return pJVar4;
}

Assistant:

JavascriptGeneratorFunction * JavascriptGeneratorFunction::OP_NewScGenFuncHomeObj(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, Var homeObj)
    {
        Assert(homeObj != nullptr);
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScGenFuncHomeObj, reentrancylock, (*infoRef)->GetFunctionProxy()->GetScriptContext()->GetThreadContext());

        JavascriptGeneratorFunction* genFunc = JavascriptGeneratorFunction::OP_NewScGenFunc(environment, infoRef);

        genFunc->SetHomeObj(homeObj);

        return genFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScGenFuncHomeObj);
    }